

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void __thiscall MdlOptions::~MdlOptions(MdlOptions *this)

{
  MdlOptions *this_local;
  
  std::__cxx11::string::~string((string *)&this->_output_file);
  std::__cxx11::string::~string((string *)&this->_input_file);
  std::__cxx11::string::~string((string *)&this->_display_driver);
  return;
}

Assistant:

MdlOptions::~MdlOptions() {
}